

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_ptr vfp_reg_ptr(TCGContext_conflict1 *tcg_ctx,_Bool dp,int reg)

{
  TCGv_ptr a;
  TCGv_ptr r;
  long b;
  TCGv_ptr ret;
  int reg_local;
  _Bool dp_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  r = tcg_temp_new_ptr(tcg_ctx);
  a = tcg_ctx->cpu_env;
  b = vfp_reg_offset(dp,reg);
  tcg_gen_addi_ptr(tcg_ctx,r,a,b);
  return r;
}

Assistant:

static TCGv_ptr vfp_reg_ptr(TCGContext *tcg_ctx, bool dp, int reg)
{
    TCGv_ptr ret = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, ret, tcg_ctx->cpu_env, vfp_reg_offset(dp, reg));
    return ret;
}